

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O1

void __thiscall bidirectional::BiDirectional::checkCriticalRes(BiDirectional *this)

{
  element_type *peVar1;
  pointer pdVar2;
  source_loc loc;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  string_view_t fmt;
  int min_r;
  int local_24;
  char *local_20;
  undefined4 uStack_18;
  undefined4 uStack_14;
  char *local_10;
  
  peVar1 = (this->best_label_).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar2 = (peVar1->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(peVar1->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar4 == 0) {
    local_24 = 0;
  }
  else {
    lVar4 = lVar4 >> 3;
    uVar6 = 0;
    dVar7 = INFINITY;
    uVar5 = 0;
    do {
      dVar8 = (this->max_res).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] - pdVar2[uVar6];
      if (dVar8 < dVar7) {
        uVar5 = uVar6 & 0xffffffff;
        dVar7 = dVar8;
      }
      local_24 = (int)uVar5;
      uVar6 = uVar6 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar6);
  }
  if (local_24 !=
      ((this->params_ptr_)._M_t.
       super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>.
       super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->critical_res) {
    if ((spdlog::details::registry::instance()::s_instance == '\0') &&
       (iVar3 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar3 != 0)
       ) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/torressa[P]cspy/src/cc/bidirectional.cc";
    uStack_18 = 0x44;
    local_10 = "checkCriticalRes";
    loc._12_4_ = uStack_14;
    loc.line = 0x44;
    loc.filename = 
    "/workspace/llm4binary/github/license_c_cmakelists/torressa[P]cspy/src/cc/bidirectional.cc";
    loc.funcname = "checkCriticalRes";
    fmt.size_ = 0x34;
    fmt.data_ = "Critical resource {} does not match final tighest {}";
    spdlog::logger::log_<int&,int&>
              ((logger *)spdlog::details::registry::instance()::s_instance._304_8_,loc,warn,fmt,
               &((this->params_ptr_)._M_t.
                 super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
                 .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->critical_res,
               &local_24);
  }
  return;
}

Assistant:

void BiDirectional::checkCriticalRes() const {
  const std::vector<double>& res      = best_label_->resource_consumption;
  double                     min_diff = std::numeric_limits<double>::infinity();
  int                        min_r    = 0;
  for (int r = 0; r < res.size(); r++) {
    const double& diff = max_res[r] - res[r];
    if (diff < min_diff) {
      min_diff = diff;
      min_r    = r;
    }
  }
  if (min_r != params_ptr_->critical_res)
    SPDLOG_WARN(
        "Critical resource {} does not match final tighest {}",
        params_ptr_->critical_res,
        min_r);
}